

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_func.cc
# Opt level: O2

void __thiscall Function::Prepare(Function *this,Env *env)

{
  Param *pPVar1;
  Env *this_00;
  ParamList *pPVar2;
  pointer ppPVar3;
  
  Env::AddID(env,this->id_,FUNC_ID,this->type_);
  Env::SetEvaluated(env,this->id_,true);
  this_00 = (Env *)operator_new(0x48);
  Env::Env(this_00,env,&this->super_Object);
  this->env_ = this_00;
  pPVar2 = this->params_;
  if (pPVar2 != (ParamList *)0x0) {
    for (ppPVar3 = (pPVar2->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppPVar3 !=
        (pPVar2->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppPVar3 = ppPVar3 + 1) {
      pPVar1 = *ppPVar3;
      Env::AddID(this->env_,pPVar1->id_,FUNC_PARAM,pPVar1->type_);
      Env::SetEvaluated(this->env_,pPVar1->id_,true);
      pPVar2 = this->params_;
    }
  }
  return;
}

Assistant:

void Function::Prepare(Env* env)
	{
	env->AddID(id_, FUNC_ID, type_);
	env->SetEvaluated(id_);

	env_ = new Env(env, this);

	foreach (i, ParamList, params_)
		{
		Param* p = *i;
		env_->AddID(p->id(), FUNC_PARAM, p->type());
		env_->SetEvaluated(p->id());
		}
	}